

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

bool __thiscall
deqp::egl::MultiThreadedConfigTest::runThread(MultiThreadedConfigTest *this,TestThread *thread)

{
  uint uVar1;
  int iVar2;
  deUint32 dVar3;
  Library *pLVar4;
  ThreadLog *pTVar5;
  ulong uVar6;
  ThreadLog *this_00;
  int getConfigsNdx;
  int iVar7;
  EndMessageToken *pEVar8;
  char *pcVar9;
  long lVar10;
  EGLint configCount;
  EGLDisplay *local_70;
  vector<void_*,_std::allocator<void_*>_> configs;
  bool local_50;
  Random rnd;
  
  pLVar4 = MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  uVar1 = thread->m_id + 0x28c3;
  uVar1 = (uVar1 >> 0x10 ^ uVar1 ^ 0x3d) * 9;
  uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
  deRandom_init(&rnd.m_rnd,uVar1 >> 0xf ^ uVar1);
  configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  local_70 = &(this->super_MultiThreadedTest).m_display;
  this_00 = &thread->m_log;
  for (iVar7 = 0; iVar7 < this->m_getConfigs; iVar7 = iVar7 + 1) {
    iVar2 = (*pLVar4->_vptr_Library[0x1a])(pLVar4,*local_70,0,0);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," = eglGetConfigs(");
    pTVar5 = ThreadLog::operator<<(this_00,local_70);
    std::operator<<((ostream *)pTVar5,", NULL, 0, ");
    std::ostream::operator<<(pTVar5,configCount);
    pEVar8 = (EndMessageToken *)0x35d5b0;
    std::operator<<((ostream *)pTVar5,")");
    ThreadLog::operator<<(pTVar5,pEVar8);
    dVar3 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
    eglu::checkError(dVar3,"eglGetConfigs()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                     ,0x238);
    if (iVar2 == 0) goto LAB_001ff5c2;
    std::vector<void_*,_std::allocator<void_*>_>::resize
              (&configs,(long)configCount +
                        ((long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3));
    if ((long)configCount != 0) {
      iVar2 = (*pLVar4->_vptr_Library[0x1a])
                        (pLVar4,*local_70,
                         configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start +
                         (((ulong)((long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3) -
                         (long)configCount));
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00," = eglGetConfigs(");
      pTVar5 = ThreadLog::operator<<(this_00,local_70);
      std::operator<<((ostream *)pTVar5,", &configs\' ");
      std::ostream::operator<<(pTVar5,configCount);
      std::operator<<((ostream *)pTVar5,", ");
      std::ostream::operator<<(pTVar5,configCount);
      pEVar8 = (EndMessageToken *)0x35d5b0;
      std::operator<<((ostream *)pTVar5,")");
      ThreadLog::operator<<(pTVar5,pEVar8);
      dVar3 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar3,"eglGetConfigs()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x247);
      if (iVar2 == 0) goto LAB_001ff5c2;
    }
    uVar6 = (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar6 < 0x29) {
      iVar2 = de::Random::getInt(&rnd,0,(int)uVar6 + -2);
      std::vector<void_*,_std::allocator<void_*>_>::erase
                (&configs,(const_iterator)
                          (configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start +
                          (((ulong)((long)configs.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                          (long)iVar2)),
                 (const_iterator)
                 configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    else {
      std::vector<void_*,_std::allocator<void_*>_>::erase
                (&configs,(const_iterator)
                          (configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x28),
                 (const_iterator)
                 configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  }
  for (iVar7 = 0; iVar7 < this->m_chooseConfigs; iVar7 = iVar7 + 1) {
    iVar2 = (*pLVar4->_vptr_Library[2])(pLVar4,*local_70,runThread::attribList,0,0,&configCount);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," = eglChooseConfig(");
    pTVar5 = ThreadLog::operator<<(this_00,local_70);
    std::operator<<((ostream *)pTVar5,", { EGL_NONE }, NULL, 0, ");
    std::ostream::operator<<(pTVar5,configCount);
    pEVar8 = (EndMessageToken *)0x35d5b0;
    std::operator<<((ostream *)pTVar5,")");
    ThreadLog::operator<<(pTVar5,pEVar8);
    dVar3 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
    eglu::checkError(dVar3,"eglChooseConfig()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                     ,0x268);
    if (iVar2 == 0) goto LAB_001ff5c2;
    std::vector<void_*,_std::allocator<void_*>_>::resize
              (&configs,(long)configCount +
                        ((long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3));
    lVar10 = (long)configCount;
    if (lVar10 != 0) {
      iVar2 = (*pLVar4->_vptr_Library[2])
                        (pLVar4,*local_70,runThread::attribList,
                         configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start +
                         (((ulong)((long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3) - lVar10),
                         lVar10,&configCount);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00," = eglChooseConfig(");
      pTVar5 = ThreadLog::operator<<(this_00,local_70);
      std::operator<<((ostream *)pTVar5,", { EGL_NONE }, &configs, ");
      std::ostream::operator<<(pTVar5,configCount);
      std::operator<<((ostream *)pTVar5,", ");
      std::ostream::operator<<(pTVar5,configCount);
      pEVar8 = (EndMessageToken *)0x35d5b0;
      std::operator<<((ostream *)pTVar5,")");
      ThreadLog::operator<<(pTVar5,pEVar8);
      dVar3 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar3,"eglChooseConfig()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x277);
      if (iVar2 == 0) goto LAB_001ff5c2;
    }
    uVar6 = (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar6 < 0x29) {
      iVar2 = de::Random::getInt(&rnd,0,(int)uVar6 + -2);
      std::vector<void_*,_std::allocator<void_*>_>::erase
                (&configs,(const_iterator)
                          (configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start +
                          (((ulong)((long)configs.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)configs.super__Vector_base<void_*,_std::allocator<void_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                          (long)iVar2)),
                 (const_iterator)
                 configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    else {
      std::vector<void_*,_std::allocator<void_*>_>::erase
                (&configs,(const_iterator)
                          (configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x28),
                 (const_iterator)
                 configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  }
  iVar7 = -1;
  do {
    iVar7 = iVar7 + 1;
    local_50 = this->m_query <= iVar7;
    if (this->m_query <= iVar7) break;
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    uVar1 = runThread::attributes[dVar3 & 0x1f];
    iVar2 = de::Random::getInt((Random *)&rnd.m_rnd,0,
                               (int)((ulong)((long)configs.
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)configs.
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                               -1);
    iVar2 = (*pLVar4->_vptr_Library[0x19])
                      (pLVar4,*local_70,
                       configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar2],(ulong)uVar1,&configCount);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," = eglGetConfigAttrib(");
    pTVar5 = ThreadLog::operator<<(this_00,local_70);
    std::operator<<((ostream *)pTVar5,", ");
    std::ostream::_M_insert<void_const*>(pTVar5);
    std::operator<<((ostream *)pTVar5,", ");
    uVar1 = uVar1 - 0x3020;
    pcVar9 = "<Unknown>";
    if (uVar1 < 0x23) {
      pcVar9 = &DAT_003293a0 + *(int *)(&DAT_003293a0 + (ulong)uVar1 * 4);
    }
    std::operator<<((ostream *)pTVar5,pcVar9);
    std::operator<<((ostream *)pTVar5,", ");
    std::ostream::operator<<(pTVar5,configCount);
    pEVar8 = (EndMessageToken *)0x35d5b0;
    std::operator<<((ostream *)pTVar5,")");
    ThreadLog::operator<<(pTVar5,pEVar8);
    dVar3 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
    eglu::checkError(dVar3,"eglGetConfigAttrib()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                     ,0x2b9);
  } while (iVar2 != 0);
LAB_001ff5ca:
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&configs.super__Vector_base<void_*,_std::allocator<void_*>_>);
  return local_50;
LAB_001ff5c2:
  local_50 = false;
  goto LAB_001ff5ca;
}

Assistant:

bool MultiThreadedConfigTest::runThread (TestThread& thread)
{
	const Library&		egl		= getLibrary();
	de::Random			rnd		(deInt32Hash(thread.getId() + 10435));
	vector<EGLConfig>	configs;

	barrier(thread);

	for (int getConfigsNdx = 0; getConfigsNdx < m_getConfigs; getConfigsNdx++)
	{
		EGLint configCount;

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", &configs' " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	for (int chooseConfigsNdx = 0; chooseConfigsNdx < m_chooseConfigs; chooseConfigsNdx++)
	{
		EGLint configCount;

		static const EGLint attribList[] = {
			EGL_NONE
		};

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, &configs, " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	{
		// Perform queries on configs
		static const EGLint attributes[] =
		{
			EGL_BUFFER_SIZE,
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_BIND_TO_TEXTURE_RGB,
			EGL_BIND_TO_TEXTURE_RGBA,
			EGL_COLOR_BUFFER_TYPE,
			EGL_CONFIG_CAVEAT,
			EGL_CONFIG_ID,
			EGL_CONFORMANT,
			EGL_DEPTH_SIZE,
			EGL_LEVEL,
			EGL_MAX_PBUFFER_WIDTH,
			EGL_MAX_PBUFFER_HEIGHT,
			EGL_MAX_PBUFFER_PIXELS,
			EGL_MAX_SWAP_INTERVAL,
			EGL_MIN_SWAP_INTERVAL,
			EGL_NATIVE_RENDERABLE,
			EGL_NATIVE_VISUAL_ID,
			EGL_NATIVE_VISUAL_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES,
			EGL_STENCIL_SIZE,
			EGL_SURFACE_TYPE,
			EGL_TRANSPARENT_TYPE,
			EGL_TRANSPARENT_RED_VALUE,
			EGL_TRANSPARENT_GREEN_VALUE,
			EGL_TRANSPARENT_BLUE_VALUE
		};

		for (int queryNdx = 0; queryNdx < m_query; queryNdx++)
		{
			const EGLint	attribute	= attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLConfig		config		= configs[rnd.getInt(0, (int)(configs.size()-1))];
			EGLint			value;
			EGLBoolean		result;

			result = egl.getConfigAttrib(m_display, config, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigAttrib(" << m_display << ", " << config << ", " << configAttributeToString(attribute) << ", " << value << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigAttrib()");

			if (!result)
				return false;
		}
	}

	return true;
}